

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O3

void QCommandLineParser::showMessageAndExit(MessageType type,QString *message,int exitCode)

{
  undefined8 *puVar1;
  QByteArray local_30;
  
  QString::toLocal8Bit(&local_30,message);
  if (local_30.d.ptr == (char *)0x0) {
    local_30.d.ptr = &QByteArray::_empty;
  }
  if (type == Information) {
    puVar1 = (undefined8 *)&stdout;
  }
  else {
    puVar1 = (undefined8 *)&stderr;
  }
  fputs(local_30.d.ptr,(FILE *)*puVar1);
  QByteArray::~QByteArray(&local_30);
  qt_call_post_routines();
  exit(exitCode);
}

Assistant:

[[noreturn]] void QCommandLineParser::showMessageAndExit(MessageType type, const QString &message, int exitCode)
{
#if defined(Q_OS_WIN) && !defined(QT_BOOTSTRAPPED)
    if (displayMessageBox()) {
        const UINT flags = MB_OK | MB_TOPMOST | MB_SETFOREGROUND
            | (type == MessageType::Information ? MB_ICONINFORMATION : MB_ICONERROR);
        QString title;
        if (QCoreApplication::instance())
            title = QCoreApplication::instance()->property("applicationDisplayName").toString();
        if (title.isEmpty())
            title = QCoreApplication::applicationName();
        MessageBoxW(0, reinterpret_cast<const wchar_t *>(message.utf16()),
                    reinterpret_cast<const wchar_t *>(title.utf16()), flags);
        qt_call_post_routines();
        ::exit(exitCode);
    }
#endif // Q_OS_WIN && !QT_BOOTSTRAPPED
    fputs(qPrintable(message), type == MessageType::Information ? stdout : stderr);
    qt_call_post_routines();
    ::exit(exitCode);
}